

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmetatype.h
# Opt level: O3

void QtPrivate::QDebugStreamOperatorForType<QJsonDocument,_true>::debugStream
               (QMetaTypeInterface *param_1,QDebug *dbg,void *a)

{
  long in_FS_OFFSET;
  QJsonDocument local_20;
  QDebug local_18;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  local_20.d._M_t.
  super___uniq_ptr_impl<QJsonDocumentPrivate,_std::default_delete<QJsonDocumentPrivate>_>._M_t.
  super__Tuple_impl<0UL,_QJsonDocumentPrivate_*,_std::default_delete<QJsonDocumentPrivate>_>.
  super__Head_base<0UL,_QJsonDocumentPrivate_*,_false>._M_head_impl =
       (unique_ptr<QJsonDocumentPrivate,_std::default_delete<QJsonDocumentPrivate>_>)dbg->stream;
  *(int *)((long)local_20.d._M_t.
                 super___uniq_ptr_impl<QJsonDocumentPrivate,_std::default_delete<QJsonDocumentPrivate>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_QJsonDocumentPrivate_*,_std::default_delete<QJsonDocumentPrivate>_>
                 .super__Head_base<0UL,_QJsonDocumentPrivate_*,_false>._M_head_impl + 0x28) =
       *(int *)((long)local_20.d._M_t.
                      super___uniq_ptr_impl<QJsonDocumentPrivate,_std::default_delete<QJsonDocumentPrivate>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_QJsonDocumentPrivate_*,_std::default_delete<QJsonDocumentPrivate>_>
                      .super__Head_base<0UL,_QJsonDocumentPrivate_*,_false>._M_head_impl + 0x28) + 1
  ;
  ::operator<<((Stream *)&local_18,&local_20);
  QDebug::~QDebug(&local_18);
  QDebug::~QDebug((QDebug *)&local_20);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void debugStream(const QMetaTypeInterface *, QDebug &dbg, const void *a)
    { dbg << *reinterpret_cast<const T *>(a); }